

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

void debug(int level,char *file,int line,string *msg)

{
  ostream *poVar1;
  string level_head;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  if (((level == 1) || (level == 2)) || (level == 4)) {
    std::__cxx11::string::assign((char *)&local_40);
  }
  else {
    std::__cxx11::string::assign((char *)&local_40);
    if ((level & 7U) == 0) goto LAB_001114cc;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,file);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,line);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)msg);
  std::endl<char,std::char_traits<char>>(poVar1);
LAB_001114cc:
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void debug(const int level, const char *file, int line, std::string msg) {
    std::string level_head;
    switch (level) {
        case INFO_FLAG:level_head = "\033[32m[info]\033[0m ";
            break;
        case WARN_FLAG:level_head = "\033[33m[warn]\033[0m ";
            break;
        case ERR_FLAG:level_head = "\033[31m[error]\033[0m ";
            break;
        default:level_head = "[unknow]";
            break;
    }

    if (level & DEBUG) {
        std::cout << level_head << file << ":" << line << ": " << msg
                  << std::endl;
    }
}